

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sudoku.cpp
# Opt level: O2

void __thiscall Sudoku::Sudoku(Sudoku *this,string *soubor)

{
  sudoku_policko *psVar1;
  int iVar2;
  uint uVar3;
  ostream *poVar4;
  istream *piVar5;
  uint uVar6;
  char *pcVar7;
  char znak;
  ifstream souborKeCteni;
  byte abStack_218 [488];
  
  memset(this,0,0x1bc);
  std::ifstream::ifstream(&souborKeCteni);
  std::ifstream::open((char *)&souborKeCteni,(_Ios_Openmode)(soubor->_M_dataplus)._M_p);
  if ((abStack_218[*(long *)(_souborKeCteni + -0x18)] & 5) == 0) {
    uVar6 = 0;
    while( true ) {
      piVar5 = std::operator>>((istream *)&souborKeCteni,&znak);
      if ((((byte)piVar5[*(long *)(*(long *)piVar5 + -0x18) + 0x20] & 5) != 0) || (0x50 < uVar6))
      break;
      if ((byte)(znak - 0x31U) < 9) {
        iVar2 = doplnK(this,uVar6 % 9,uVar6 / 9,(byte)znak - 0x30);
        if (iVar2 == 0) {
          std::ifstream::close();
          pcVar7 = "Soubor neodpovida pravidlum sudoku.";
          goto LAB_00103de3;
        }
        psVar1 = (this->s).pole + uVar6;
        *(byte *)psVar1 = *(byte *)psVar1 | 0x10;
        uVar3 = 1;
      }
      else {
        uVar3 = (uint)((znak & 0xfdU) == 0x2c);
      }
      uVar6 = uVar6 + uVar3;
    }
    if (uVar6 != 0x51) {
      std::ifstream::close();
      pcVar7 = "Soubor neobsahuje cele sudoku.";
LAB_00103de3:
      (this->s).stav = 1;
      poVar4 = std::operator<<((ostream *)&std::cerr,pcVar7);
      std::endl<char,std::char_traits<char>>(poVar4);
      goto LAB_00103e01;
    }
    uVar6 = 2;
  }
  else {
    poVar4 = std::operator<<((ostream *)&std::cerr,"Soubor ");
    poVar4 = std::operator<<(poVar4,(string *)soubor);
    poVar4 = std::operator<<(poVar4," nelze precist.");
    std::endl<char,std::char_traits<char>>(poVar4);
    uVar6 = 1;
  }
  (this->s).stav = uVar6;
LAB_00103e01:
  std::ifstream::~ifstream(&souborKeCteni);
  return;
}

Assistant:

Sudoku::Sudoku(string soubor)
{
  char znak;
  int index = 0;
  initPole();// vynulujeme pole
  // otevreme soubor pro cteni
  ifstream souborKeCteni;
  souborKeCteni.open(soubor.c_str());

  if (!souborKeCteni) // nepodarilo se?
  {
    cerr << "Soubor " << soubor << " nelze precist." << endl;
    s.stav= _chyba; // nastavime chybovy stav a vratime se
    return;
  }
  while ((souborKeCteni >> znak) && (index < 81)) // cteni ze souboru po znacich dokud nemame cele sudoku prectene
  {
    if(znak >= '1' && znak <= '9')// je to cislo?
    {
      if (doplnK(index %9, index/9, znak - '1' + 1)) // zkusime ho doplnit do sudoku
      {
        s.pole[index].pevne = 1; // vsechna policka nactena za souboru jsou pevna
        index++;
        continue;// kdyz se povede, pokracujeme dalsim znakem
      }
      // pokud se nepodari doplnit, propadne to sem, dojde k chybe
      souborKeCteni.close();
      s.stav= _chyba;
      cerr << "Soubor neodpovida pravidlum sudoku." << endl;
      return;
    }
    else if(znak == '.' || znak == ',')// je to tecka nebo carka?
    {
      index++;// prazdne policko -> posuneme se o policko dal
    }
    // jinak se nic nedeje.
  }
  if(index != 81)// pokud jsme nedosli na konec sudoku, znamena to, ze ho kus chybi
  {
    // uklidime a nastavime chybovy stav
    souborKeCteni.close();
    s.stav= _chyba;
    cerr << "Soubor neobsahuje cele sudoku." << endl;
    return;
  }
  s.stav = _nastavene; // vse OK
}